

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classviewer.cpp
# Opt level: O3

char * getFormattedConstant(cp_info *constantPool,u2 index)

{
  byte bVar1;
  u2 uVar2;
  u4 uVar3;
  u1 *puVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  size_t sVar13;
  char *__dest;
  ostream *poVar14;
  uint uVar15;
  ulong uVar16;
  ushort uVar17;
  u2 index_00;
  uint uVar18;
  double dVar19;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  uVar16 = (ulong)index;
  do {
    uVar8 = uVar16 & 0xffff;
    uVar18 = constantPool[uVar8 - 1].info.long_info.high_bytes;
    uVar16 = (ulong)uVar18;
    bVar1 = constantPool[uVar8 - 1].tag;
  } while (bVar1 - 7 < 2);
  index_00 = (u2)uVar18;
  switch(bVar1) {
  case 1:
    puVar4 = constantPool[uVar8 - 1].info.utf8_info.bytes;
    pcVar10 = (char *)malloc((ulong)((uVar18 & 0xffff) + 1));
    if ((uVar18 & 0xffff) == 0) {
      uVar16 = 0;
    }
    else {
      uVar16 = 0;
      uVar17 = 0;
      do {
        bVar1 = puVar4[uVar16];
        iVar6 = isprint((uint)bVar1);
        if (iVar6 != 0) {
          uVar8 = (ulong)uVar17;
          uVar17 = uVar17 + 1;
          pcVar10[uVar8] = bVar1;
        }
        uVar16 = uVar16 + 1;
      } while ((uVar18 & 0xffff) != uVar16);
      uVar16 = (ulong)uVar17;
    }
    pcVar10[uVar16] = '\0';
    break;
  default:
    poVar14 = std::operator<<((ostream *)&std::cerr,"Arquivo .class possui uma tag ");
    poVar14 = std::operator<<(poVar14,bVar1);
    poVar14 = std::operator<<(poVar14," invalida no pool de constantes.");
    std::endl<char,std::char_traits<char>>(poVar14);
    exit(5);
  case 3:
    pcVar10 = (char *)malloc(100);
    sprintf(pcVar10,"%d",uVar16);
    break;
  case 4:
    uVar15 = uVar18 >> 0x17 & 0xff;
    uVar5 = uVar18 & 0x7fffff | 0x800000;
    if (uVar15 == 0) {
      uVar5 = uVar18 * 2 & 0xfffffe;
    }
    uVar7 = -uVar5;
    if (-1 < (int)uVar18) {
      uVar7 = uVar5;
    }
    dVar19 = ldexp(1.0,uVar15 - 0x96);
    pcVar10 = (char *)malloc(100);
    dVar19 = (double)(float)(dVar19 * (double)(int)uVar7);
    goto LAB_0010fb0f;
  case 5:
    uVar3 = constantPool[uVar8 - 1].info.long_info.low_bytes;
    pcVar10 = (char *)malloc(100);
    sprintf(pcVar10,"%lld",CONCAT44(uVar18,uVar3));
    break;
  case 6:
    uVar9 = CONCAT44(uVar18,constantPool[uVar8 - 1].info.long_info.low_bytes);
    uVar18 = uVar18 >> 0x14 & 0x7ff;
    uVar8 = (uVar9 & 0xfffffffffffff) + 0x10000000000000;
    if (uVar18 == 0) {
      uVar8 = uVar9 * 2 & 0x1ffffffffffffe;
    }
    uVar9 = -uVar8;
    if (-1 < (long)(uVar16 << 0x20)) {
      uVar9 = uVar8;
    }
    dVar19 = ldexp(1.0,uVar18 - 0x433);
    dVar19 = dVar19 * (double)(long)uVar9;
    pcVar10 = (char *)malloc(100);
LAB_0010fb0f:
    sprintf(pcVar10,"%f",dVar19);
    break;
  case 9:
    uVar2 = constantPool[(ulong)(uVar18 >> 0x10) - 1].info.fieldref_info.class_index;
    pcVar10 = getFormattedConstant(constantPool,index_00);
    pcVar11 = getFormattedConstant(constantPool,uVar2);
    std::__cxx11::stringstream::stringstream(local_1b8);
    iVar6 = (int)(ostream *)local_1a8;
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar6 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
    if (pcVar11 == (char *)0x0) {
      std::ios::clear(iVar6 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar12 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar12);
    }
    pcVar10 = Utils::streamToCString((stringstream *)local_1b8);
    goto LAB_0010fcf0;
  case 10:
    uVar2 = constantPool[(ulong)(uVar18 >> 0x10) - 1].info.fieldref_info.class_index;
    pcVar10 = getFormattedConstant(constantPool,index_00);
    pcVar11 = getFormattedConstant(constantPool,uVar2);
    std::__cxx11::stringstream::stringstream(local_1b8);
    iVar6 = (int)(ostream *)local_1a8;
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar6 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
    if (pcVar11 == (char *)0x0) {
      std::ios::clear(iVar6 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar12 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar12);
    }
    pcVar10 = Utils::streamToCString((stringstream *)local_1b8);
    goto LAB_0010fcf0;
  case 0xb:
    uVar2 = constantPool[(ulong)(uVar18 >> 0x10) - 1].info.fieldref_info.class_index;
    pcVar10 = getFormattedConstant(constantPool,index_00);
    pcVar11 = getFormattedConstant(constantPool,uVar2);
    std::__cxx11::stringstream::stringstream(local_1b8);
    iVar6 = (int)(ostream *)local_1a8;
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar6 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
    if (pcVar11 == (char *)0x0) {
      std::ios::clear(iVar6 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar12 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar12);
    }
    pcVar10 = Utils::streamToCString((stringstream *)local_1b8);
LAB_0010fcf0:
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    break;
  case 0xc:
    pcVar10 = getFormattedConstant(constantPool,index_00);
    pcVar11 = getFormattedConstant(constantPool,(u2)(uVar18 >> 0x10));
    sVar12 = strlen(pcVar10);
    sVar13 = strlen(pcVar11);
    __dest = (char *)malloc(sVar12 + sVar13 + 1);
    strcpy(__dest,pcVar10);
    pcVar10 = strcat(__dest,pcVar11);
    return pcVar10;
  }
  return pcVar10;
}

Assistant:

const char* getFormattedConstant(cp_info* constantPool, u2 index) {
    cp_info constant = constantPool[index-1];
    
    if (constant.tag == CONSTANT_Class) {
        CONSTANT_Class_info classInfo = constant.info.class_info;
        return getFormattedConstant(constantPool, classInfo.name_index);
    } else if (constant.tag == CONSTANT_Fieldref) {
        CONSTANT_Fieldref_info fieldRefInfo = constant.info.fieldref_info;
        CONSTANT_NameAndType_info nameAndTypeInfo = constantPool[fieldRefInfo.name_and_type_index-1].info.nameAndType_info;
        
        const char *className = getFormattedConstant(constantPool, fieldRefInfo.class_index);
        const char *name = getFormattedConstant(constantPool, nameAndTypeInfo.name_index);
        
        stringstream ss;
        ss << className << "." << name;
        return Utils::streamToCString(ss);
    } else if (constant.tag == CONSTANT_Methodref) {
        CONSTANT_Methodref_info methodRefInfo = constant.info.methodref_info;
        CONSTANT_NameAndType_info nameAndTypeInfo = constantPool[methodRefInfo.name_and_type_index-1].info.nameAndType_info;
        
        const char *className = getFormattedConstant(constantPool, methodRefInfo.class_index);
        const char *name = getFormattedConstant(constantPool, nameAndTypeInfo.name_index);
        
        stringstream ss;
        ss << className << "." << name;
        return Utils::streamToCString(ss);
    } else if (constant.tag == CONSTANT_InterfaceMethodref) {
        CONSTANT_InterfaceMethodref_info interfaceMethodRefInfo = constant.info.interfaceMethodref_info;
        CONSTANT_NameAndType_info nameAndTypeInfo = constantPool[interfaceMethodRefInfo.name_and_type_index-1].info.nameAndType_info;
        
        const char *className = getFormattedConstant(constantPool, interfaceMethodRefInfo.class_index);
        const char *name = getFormattedConstant(constantPool, nameAndTypeInfo.name_index);
        
        stringstream ss;
        ss << className << "." << name;
        return Utils::streamToCString(ss);
    } else if (constant.tag == CONSTANT_String) {
        CONSTANT_String_info stringInfo = constant.info.string_info;
        return getFormattedConstant(constantPool, stringInfo.string_index);
    } else if (constant.tag == CONSTANT_Integer) {
        CONSTANT_Integer_info intInfo = constant.info.integer_info;
        int32_t number = intInfo.bytes;
        char *s = (char*) malloc(sizeof(char)*100);
        sprintf(s, "%d", number);
        return s;
    } else if (constant.tag == CONSTANT_Float) {
        CONSTANT_Float_info floatInfo = constant.info.float_info;
        
        int32_t s = ((floatInfo.bytes >> 31) == 0) ? 1 : -1;
        int32_t e = ((floatInfo.bytes >> 23) & 0xff);
        int32_t m = (e == 0) ? (floatInfo.bytes & 0x7fffff) << 1 : (floatInfo.bytes & 0x7fffff) | 0x800000;
        float number = s * m * pow(2, e-150);
        
        char *str = (char*) malloc(sizeof(char)*100);
        sprintf(str, "%f", number);
        return str;
    } else if (constant.tag == CONSTANT_Long) {
        CONSTANT_Long_info longInfo = constant.info.long_info;
        int64_t number = ((int64_t) longInfo.high_bytes << 32) + longInfo.low_bytes;
        
        char *str = (char*) malloc(sizeof(char)*100);
        sprintf(str, "%lld", number);
        return str;
    } else if (constant.tag == CONSTANT_Double) {
        CONSTANT_Double_info doubleInfo = constant.info.double_info;
        int64_t bytes = ((int64_t) doubleInfo.high_bytes << 32) + doubleInfo.low_bytes;
        
        int32_t s = ((bytes >> 63) == 0) ? 1 : -1;
        int32_t e = (int32_t)((bytes >> 52) & 0x7ffL);
        int64_t m = (e == 0) ? (bytes & 0xfffffffffffffL) << 1 : (bytes & 0xfffffffffffffL) | 0x10000000000000L;
        double number = s * m * pow(2, e-1075);
        
        char *str = (char*) malloc(sizeof(char)*100);
        sprintf(str, "%f", number);
        return str;
    } else if (constant.tag == CONSTANT_NameAndType) {
        CONSTANT_NameAndType_info nameAndTypeInfo = constant.info.nameAndType_info;
        
        const char *name = getFormattedConstant(constantPool, nameAndTypeInfo.name_index);
        const char *descriptor = getFormattedConstant(constantPool, nameAndTypeInfo.descriptor_index);
        
        char *result = (char*) malloc(sizeof(char)*(strlen(name)+strlen(descriptor)) + 1);
        strcpy(result, name);
        strcat(result, descriptor);
        
        return result;
    } else if (constant.tag == CONSTANT_Utf8) {
        CONSTANT_Utf8_info utf8_info = constant.info.utf8_info;
        char *str = (char*) malloc((utf8_info.length + 1) * sizeof(char));
        
        uint16_t j = 0;
        for (uint16_t i = 0; i < utf8_info.length; i++) {
            if (isprint(utf8_info.bytes[i])) str[j++] = utf8_info.bytes[i];
        }
        str[j] = '\0';
        
        return str;
    } else {
        cerr << "Arquivo .class possui uma tag " << constant.tag << " invalida no pool de constantes." << endl;
        exit(5);
    }
    
    return NULL;
}